

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

int __thiscall bdQuery::trimProxies(bdQuery *this)

{
  size_type sVar1;
  bdQuery *this_local;
  
  while (sVar1 = std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::size(&this->mProxiesUnknown),
        10 < sVar1) {
    std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::pop_back(&this->mProxiesUnknown);
  }
  while (sVar1 = std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::size(&this->mProxiesFlagged),
        10 < sVar1) {
    std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::pop_back(&this->mProxiesFlagged);
  }
  return 1;
}

Assistant:

int bdQuery::trimProxies() {

	/* drop excess Potential Proxies */
	while(mProxiesUnknown.size() > MAX_POTENTIAL_PROXIES)
		mProxiesUnknown.pop_back();

	while(mProxiesFlagged.size() > MAX_POTENTIAL_PROXIES)
		mProxiesFlagged.pop_back();
	return 1;
}